

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceShape.cpp
# Opt level: O2

void __thiscall chrono::ChSurfaceShape::ArchiveIN(ChSurfaceShape *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_78;
  ChNameValue<int> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<std::shared_ptr<chrono::geometry::ChSurface>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChSurfaceShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30._value = &this->gsurface;
  local_30._name = "gsurface";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->wireframe;
  local_48._name = "wireframe";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->resolution_U;
  local_60._name = "resolution_U";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->resolution_V;
  local_78._name = "resolution_V";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  return;
}

Assistant:

void ChSurfaceShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSurfaceShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gsurface);
    marchive >> CHNVP(wireframe);
    marchive >> CHNVP(resolution_U);
    marchive >> CHNVP(resolution_V);
}